

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O1

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetGame(TgTypeParser *this,ptree *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var4;
  size_type sVar5;
  iterator iVar6;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  Ptr PVar8;
  Ptr PVar9;
  path_type local_a8;
  type local_78;
  TgTypeParser *local_50;
  vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  local_48;
  
  *(undefined8 *)this = 0;
  local_50 = this + 8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TgBot::Game,std::allocator<TgBot::Game>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_50,(Game **)this,
             (allocator<TgBot::Game> *)&local_a8);
  paVar1 = &local_a8.m_value.field_2;
  local_a8.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"title","");
  local_a8.m_separator = '.';
  local_a8.m_start._M_current = local_a8.m_value._M_dataplus._M_p;
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_78,in_RDX,&local_a8,"");
  std::__cxx11::string::operator=(*(string **)this,(string *)&local_78);
  paVar2 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.m_value._M_dataplus._M_p);
  }
  local_a8.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"description","");
  local_a8.m_separator = '.';
  local_a8.m_start._M_current = local_a8.m_value._M_dataplus._M_p;
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_78,in_RDX,&local_a8,"");
  std::__cxx11::string::operator=((string *)(*(long *)this + 0x20),(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.m_value._M_dataplus._M_p);
  }
  local_a8.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"photo","");
  parseJsonAndGetArray<TgBot::PhotoSize>
            ((vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
              *)&local_48,(TgTypeParser *)data,0x1b7b2e,(ptree *)0x0,&in_RDX->m_data);
  lVar3 = *(long *)this;
  local_78._M_dataplus._M_p = *(pointer *)(lVar3 + 0x40);
  local_78._M_string_length = *(size_type *)(lVar3 + 0x48);
  local_78.field_2._M_allocated_capacity = *(size_type *)(lVar3 + 0x50);
  *(pointer *)(lVar3 + 0x40) =
       local_48.
       super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(lVar3 + 0x48) =
       local_48.
       super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)(lVar3 + 0x50) =
       local_48.
       super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>::
  ~vector((vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
           *)&local_78);
  std::
  vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>::
  ~vector((vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
           *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.m_value._M_dataplus._M_p);
  }
  local_a8.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"text","");
  local_a8.m_separator = '.';
  local_a8.m_start._M_current = local_a8.m_value._M_dataplus._M_p;
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_78,in_RDX,&local_a8,"");
  std::__cxx11::string::operator=((string *)(*(long *)this + 0x58),(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.m_value._M_dataplus._M_p);
  }
  local_a8.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"text_entities","");
  parseJsonAndGetArray<TgBot::MessageEntity>
            (&local_48,(TgTypeParser *)data,0x1b65d0,(ptree *)0x0,&in_RDX->m_data);
  lVar3 = *(long *)this;
  local_78._M_dataplus._M_p = *(pointer *)(lVar3 + 0x78);
  local_78._M_string_length = *(size_type *)(lVar3 + 0x80);
  local_78.field_2._M_allocated_capacity = *(size_type *)(lVar3 + 0x88);
  *(pointer *)(lVar3 + 0x78) =
       local_48.
       super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(lVar3 + 0x80) =
       local_48.
       super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)(lVar3 + 0x88) =
       local_48.
       super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ::~vector((vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
             *)&local_78);
  std::
  vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ::~vector(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.m_value._M_dataplus._M_p);
  }
  local_a8.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"animation","");
  iVar6 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string...,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string___,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)((long)in_RDX->m_children + 0x10),&local_a8.m_value);
  if (iVar6.node ==
      *(ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        **)((long)in_RDX->m_children + 8)) {
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    _Var7._M_pi = extraout_RDX;
  }
  else {
    PVar8 = parseJsonAndGetAnimation((TgTypeParser *)&local_78,data);
    _Var7 = PVar8.super___shared_ptr<TgBot::Animation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
  }
  sVar5 = local_78._M_string_length;
  _Var4._M_p = local_78._M_dataplus._M_p;
  lVar3 = *(long *)this;
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x98);
  *(pointer *)(lVar3 + 0x90) = _Var4._M_p;
  *(size_type *)(lVar3 + 0x98) = sVar5;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var7._M_pi = extraout_RDX_00;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
    _Var7._M_pi = extraout_RDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.m_value._M_dataplus._M_p);
    _Var7._M_pi = extraout_RDX_02;
  }
  PVar9.super___shared_ptr<TgBot::Game,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var7._M_pi;
  PVar9.super___shared_ptr<TgBot::Game,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Ptr)PVar9.super___shared_ptr<TgBot::Game,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Game::Ptr TgTypeParser::parseJsonAndGetGame(const ptree& data) const {
    auto result(make_shared<Game>());
    result->title = data.get("title", "");
    result->description = data.get("description", "");
    result->photo = parseJsonAndGetArray<PhotoSize>(&TgTypeParser::parseJsonAndGetPhotoSize, data, "photo");
    result->text = data.get("text", "");
    result->textEntities = parseJsonAndGetArray<MessageEntity>(&TgTypeParser::parseJsonAndGetMessageEntity, data, "text_entities");
    result->animation = tryParseJson<Animation>(&TgTypeParser::parseJsonAndGetAnimation, data, "animation");
    return result;
}